

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

tm * __thiscall cmCTest::GetNightlyTime(cmCTest *this,string *str,bool tomorrowtag)

{
  char cVar1;
  tm *ptVar2;
  ostream *poVar3;
  long lVar4;
  undefined7 in_register_00000011;
  long lVar5;
  long lVar6;
  time_t tctime;
  time_t ntime;
  ostringstream cmCTestLog_msg;
  char buf [1024];
  long *local_5f0;
  long local_5e0 [2];
  cmCTest *local_5d0;
  time_t local_5c8;
  long local_5c0;
  undefined4 local_5b4;
  long local_5b0 [14];
  ios_base local_540 [264];
  char local_438 [1032];
  
  local_5d0 = this;
  local_5c8 = time((time_t *)0x0);
  ptVar2 = gmtime(&local_5c8);
  sprintf(local_438,"%d%02d%02d %s",(ulong)(ptVar2->tm_year + 0x76c),(ulong)(ptVar2->tm_mon + 1),
          (ulong)(uint)ptVar2->tm_mday);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5b0,"Determine Nightly Start Time",0x1c);
  std::ios::widen((char)(ostringstream *)local_5b0 + (char)*(undefined8 *)(local_5b0[0] + -0x18));
  std::ostream::put((char)local_5b0);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"   Specified time: ",0x13);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(str->_M_dataplus)._M_p,str->_M_string_length);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5d0,1,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x4f,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  lVar4 = curl_getdate(local_438,&local_5c8);
  local_5c0 = lVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"   Get curl time: ",0x12)
  ;
  poVar3 = std::ostream::_M_insert<long>((long)local_5b0);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5d0,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x57,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  local_5c8 = time((time_t *)0x0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5b0,"   Get the current time: ",0x19);
  poVar3 = std::ostream::_M_insert<long>((long)local_5b0);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5d0,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x59,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Seconds: ",9);
  poVar3 = std::ostream::_M_insert<long>((long)local_5b0);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5d0,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x5c,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  local_5b4 = (undefined4)CONCAT71(in_register_00000011,tomorrowtag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  if (local_5c8 < lVar4) {
    do {
      lVar4 = lVar4 + -0x15180;
      local_5c0 = lVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Pick yesterday",0xe);
      cVar1 = (char)(ostringstream *)local_5b0;
      std::ios::widen((char)*(undefined8 *)(local_5b0[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(local_5d0,0,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,100,(char *)local_5f0,false);
      if (local_5f0 != local_5e0) {
        operator_delete(local_5f0,local_5e0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      std::ios_base::~ios_base(local_540);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,"   Future time, subtract day: ",0x1e);
      poVar3 = std::ostream::_M_insert<long>((long)local_5b0);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(local_5d0,0,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x66,(char *)local_5f0,false);
      if (local_5f0 != local_5e0) {
        operator_delete(local_5f0,local_5e0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      std::ios_base::~ios_base(local_540);
    } while (local_5c8 < lVar4);
  }
  if (lVar4 + 0x15180 < local_5c8) {
    lVar5 = lVar4;
    do {
      lVar4 = lVar5 + 0x15180;
      local_5c0 = lVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,"   Past time, add day: ",0x17);
      poVar3 = std::ostream::_M_insert<long>((long)local_5b0);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(local_5d0,0,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x6a,(char *)local_5f0,false);
      if (local_5f0 != local_5e0) {
        operator_delete(local_5f0,local_5e0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      std::ios_base::~ios_base(local_540);
      lVar6 = lVar5 + 0x2a300;
      lVar5 = lVar4;
    } while (lVar6 < local_5c8);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"nightlySeconds: ",0x10);
  poVar3 = std::ostream::_M_insert<long>((long)local_5b0);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5d0,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x6c,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"   Current time: ",0x11);
  poVar3 = std::ostream::_M_insert<long>((long)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Nightly time: ",0xf);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_5d0,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x6e,(char *)local_5f0,false);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  if ((char)local_5b4 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b0,"   Use future tag, Add a day",0x1c);
    std::ios::widen((char)(ostringstream *)local_5b0 + (char)*(undefined8 *)(local_5b0[0] + -0x18));
    std::ostream::put((char)local_5b0);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_5d0,1,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x70,(char *)local_5f0,false);
    if (local_5f0 != local_5e0) {
      operator_delete(local_5f0,local_5e0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
    std::ios_base::~ios_base(local_540);
    local_5c0 = lVar4 + 0x15180;
  }
  ptVar2 = gmtime(&local_5c0);
  return (tm *)ptVar2;
}

Assistant:

struct tm* cmCTest::GetNightlyTime(std::string const& str, bool tomorrowtag)
{
  struct tm* lctime;
  time_t tctime = time(CM_NULLPTR);
  lctime = gmtime(&tctime);
  char buf[1024];
  // add todays year day and month to the time in str because
  // curl_getdate no longer assumes the day is today
  sprintf(buf, "%d%02d%02d %s", lctime->tm_year + 1900, lctime->tm_mon + 1,
          lctime->tm_mday, str.c_str());
  cmCTestLog(this, OUTPUT, "Determine Nightly Start Time"
               << std::endl
               << "   Specified time: " << str << std::endl);
  // Convert the nightly start time to seconds. Since we are
  // providing only a time and a timezone, the current date of
  // the local machine is assumed. Consequently, nightlySeconds
  // is the time at which the nightly dashboard was opened or
  // will be opened on the date of the current client machine.
  // As such, this time may be in the past or in the future.
  time_t ntime = curl_getdate(buf, &tctime);
  cmCTestLog(this, DEBUG, "   Get curl time: " << ntime << std::endl);
  tctime = time(CM_NULLPTR);
  cmCTestLog(this, DEBUG, "   Get the current time: " << tctime << std::endl);

  const int dayLength = 24 * 60 * 60;
  cmCTestLog(this, DEBUG, "Seconds: " << tctime << std::endl);
  while (ntime > tctime) {
    // If nightlySeconds is in the past, this is the current
    // open dashboard, then return nightlySeconds.  If
    // nightlySeconds is in the future, this is the next
    // dashboard to be opened, so subtract 24 hours to get the
    // time of the current open dashboard
    ntime -= dayLength;
    cmCTestLog(this, DEBUG, "Pick yesterday" << std::endl);
    cmCTestLog(this, DEBUG, "   Future time, subtract day: " << ntime
                                                             << std::endl);
  }
  while (tctime > (ntime + dayLength)) {
    ntime += dayLength;
    cmCTestLog(this, DEBUG, "   Past time, add day: " << ntime << std::endl);
  }
  cmCTestLog(this, DEBUG, "nightlySeconds: " << ntime << std::endl);
  cmCTestLog(this, DEBUG, "   Current time: " << tctime << " Nightly time: "
                                              << ntime << std::endl);
  if (tomorrowtag) {
    cmCTestLog(this, OUTPUT, "   Use future tag, Add a day" << std::endl);
    ntime += dayLength;
  }
  lctime = gmtime(&ntime);
  return lctime;
}